

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TxFormats.cpp
# Opt level: O2

void __thiscall jbcoin::TxFormats::addCommonFields(TxFormats *this,Item *item)

{
  SOE_Flags SVar1;
  SOElement local_f0;
  SOElement local_e0;
  SOElement local_d0;
  SOElement local_c0;
  SOElement local_b0;
  SOElement local_a0;
  SOElement local_90;
  SOElement local_80;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  SOElement local_30;
  SOElement local_20;
  
  local_20.e_field = (SField *)&sfTransactionType;
  local_20.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_20);
  local_30.e_field = (SField *)sfFlags;
  SVar1 = SOE_OPTIONAL;
  local_30.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_30);
  local_40.e_field = (SField *)sfSourceTag;
  local_40.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_40);
  local_50.e_field = (SField *)sfAccount;
  local_50.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_50);
  local_60.e_field = (SField *)sfSequence;
  local_60.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_60);
  local_70.e_field = (SField *)sfPreviousTxnID;
  local_70.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_70);
  local_80.e_field = (SField *)sfLastLedgerSequence;
  local_80.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_80);
  local_90.e_field = (SField *)sfAccountTxnID;
  local_90.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_90);
  local_a0.e_field = (SField *)sfFee;
  local_a0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_a0);
  local_b0.e_field = (SField *)sfOperationLimit;
  local_b0.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_b0);
  local_c0.e_field = (SField *)sfMemos;
  local_c0.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_c0);
  local_d0.e_field = (SField *)sfSigningPubKey;
  local_d0.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_d0);
  local_e0.e_field = (SField *)sfTxnSignature;
  local_e0.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_e0);
  local_f0.e_field = (SField *)sfSigners;
  local_f0.flags = SVar1;
  SOTemplate::push_back(&item->elements,&local_f0);
  return;
}

Assistant:

void TxFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfTransactionType,     SOE_REQUIRED)
        << SOElement(sfFlags,               SOE_OPTIONAL)
        << SOElement(sfSourceTag,           SOE_OPTIONAL)
        << SOElement(sfAccount,             SOE_REQUIRED)
        << SOElement(sfSequence,            SOE_REQUIRED)
        << SOElement(sfPreviousTxnID,       SOE_OPTIONAL) // emulate027
        << SOElement(sfLastLedgerSequence,  SOE_OPTIONAL)
        << SOElement(sfAccountTxnID,        SOE_OPTIONAL)
        << SOElement(sfFee,                 SOE_REQUIRED)
        << SOElement(sfOperationLimit,      SOE_OPTIONAL)
        << SOElement(sfMemos,               SOE_OPTIONAL)
        << SOElement(sfSigningPubKey,       SOE_REQUIRED)
        << SOElement(sfTxnSignature,        SOE_OPTIONAL)
        << SOElement(sfSigners,             SOE_OPTIONAL) // submit_multisigned
        ;
}